

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slgh_compile.cc
# Opt level: O1

bool __thiscall
ConsistencyChecker::checkSectionTruncations
          (ConsistencyChecker *this,Constructor *ct,ConstructTpl *cttpl,bool isbigendian)

{
  OpTpl *op;
  bool bVar1;
  bool bVar2;
  pointer ppVVar3;
  bool bVar4;
  pointer ppOVar5;
  long lVar6;
  
  ppOVar5 = (cttpl->vec).super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppOVar5 ==
      (cttpl->vec).super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar4 = true;
  }
  else {
    bVar2 = true;
    bVar4 = true;
    do {
      op = *ppOVar5;
      if ((op->output != (VarnodeTpl *)0x0) &&
         (bVar1 = checkVarnodeTruncation(this,ct,-1,op,op->output,isbigendian), !bVar1)) {
        bVar2 = false;
        bVar4 = false;
      }
      ppVVar3 = (op->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(op->input).
                                  super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar3) >> 3))
      {
        lVar6 = 0;
        bVar4 = bVar2;
        do {
          bVar2 = checkVarnodeTruncation(this,ct,(int4)lVar6,op,ppVVar3[lVar6],isbigendian);
          if (!bVar2) {
            bVar4 = false;
          }
          lVar6 = lVar6 + 1;
          ppVVar3 = (op->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          bVar2 = bVar4;
        } while (lVar6 < (int)((ulong)((long)(op->input).
                                             super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)ppVVar3) >> 3));
      }
      ppOVar5 = ppOVar5 + 1;
    } while (ppOVar5 !=
             (cttpl->vec).super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return bVar4;
}

Assistant:

bool ConsistencyChecker::checkSectionTruncations(Constructor *ct,ConstructTpl *cttpl,bool isbigendian)

{ // Check all the varnodes that have an offset_plus template
  //     adjust the plus if we are bigendian
  //     make sure the truncation is valid
  vector<OpTpl *>::const_iterator iter;
  const vector<OpTpl *> &ops(cttpl->getOpvec());
  bool testresult = true;
  
  for(iter=ops.begin();iter!=ops.end();++iter) {
    OpTpl *op = *iter;
    VarnodeTpl *outvn = op->getOut();
    if (outvn != (VarnodeTpl *)0) {
      if (!checkVarnodeTruncation(ct,-1,op,outvn,isbigendian))
	testresult = false;
    }
    for(int4 i=0;i<op->numInput();++i) {
      if (!checkVarnodeTruncation(ct,i,op,op->getIn(i),isbigendian))
	testresult = false;
    }
  }
  return testresult;
}